

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QByteArray>::moveAppend
          (QGenericArrayOps<QByteArray> *this,QByteArray *b,QByteArray *e)

{
  qsizetype *pqVar1;
  QByteArray *pQVar2;
  long lVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QByteArray>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QByteArray>).size;
      pDVar4 = (b->d).d;
      (b->d).d = (Data *)0x0;
      pQVar2[lVar3].d.d = pDVar4;
      pcVar5 = (b->d).ptr;
      (b->d).ptr = (char *)0x0;
      pQVar2[lVar3].d.ptr = pcVar5;
      qVar6 = (b->d).size;
      (b->d).size = 0;
      pQVar2[lVar3].d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QByteArray>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }